

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_ctstring.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  size_t buf [77];
  XChars<_F_,__A_,__R_,__E_,__W_,__E_,__L_,__L_,__:_,____,__T_,__H_,__I_,__S_,____,__S_,__T_,__R_,__I_,__N_,__G_,____,__S_,__H_,__O_,__U_,__L_,__D_,____,__N_,__O_,__T_,____,__B_,__E_,____,__S_,__E_,__E_,__N_,____,__I_,__N_,____,__B_,__I_,__N_,__A_,__R_,__Y_,____,__E_,__I_,__T_,__H_,__E_,__R_,____,__F_,__U_,__L_,__L_,____,__O_,__R_,____,__I_,__N_,____,__P_,__I_,__E_,__C_,__E_,__S_,____>
  xsHidden;
  char csz_2 [12];
  Chars<_H_,__E_,__L_,__L_,__O_> sample3;
  char csz_1 [12];
  char csz [12];
  CaseChars<_H_,__e_,__l_,__l_,__o_> sample2;
  Chars<_H_,__e_,__l_,__l_,__o_> sample1;
  string *result;
  char *p;
  string *in_stack_fffffffffffff7a8;
  ostream *in_stack_fffffffffffff7b0;
  undefined7 in_stack_fffffffffffff7d8;
  undefined1 uVar5;
  char local_808 [632];
  undefined1 local_590 [31];
  undefined1 local_571;
  undefined8 local_570;
  undefined4 local_568;
  undefined1 local_561;
  undefined8 local_560;
  undefined4 local_558;
  undefined8 local_550;
  undefined4 local_548;
  undefined1 local_542;
  undefined1 local_541;
  undefined4 local_530;
  undefined1 local_519;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  ulong local_288;
  char *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_530 = 0;
  local_541 = 0;
  local_542 = 0;
  pcVar2 = cts::Chars<'H',_'e',_'l',_'l',_'o'>::c_str();
  uVar5 = 0;
  printf("plain 1: %s\n",pcVar2);
  pcVar2 = cts::CaseChars<'H',_'e',_'l',_'l',_'o'>::c_str();
  printf("plain 2: %s\n",pcVar2);
  local_550 = 0x6f57206f6c6c6548;
  local_548 = 0x646c72;
  local_560 = 0x6f77206f6c6c6568;
  local_558 = 0x646c72;
  local_561 = 0;
  local_570 = 0x6f77204f4c6c6568;
  local_568 = 0x444c72;
  local_571 = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"xored: ");
  local_510 = local_590;
  local_518 = &local_571;
  local_519 = 0;
  cts::
  XChars<'F',_'A',_'R',_'E',_'W',_'E',_'L',_'L',_':',_'_',_'T',_'H',_'I',_'S',_'_',_'S',_'T',_'R',_'I',_'N',_'G',_'_',_'S',_'H',_'O',_'U',_'L',_'D',_'_',_'N',_'O',_'T',_'_',_'B',_'E',_'_',_'S',_'E',_'E',_'N',_'_',_'I',_'N',_'_',_'B',_'I',_'N',_'A',_'R',_'Y',_'_',_'E',_'I',_'T',_'H',_'E',_'R',_'_',_'F',_'U',_'L',_'L',_'_',_'O',_'R',_'_',_'I',_'N',_'_',_'P',_'I',_'E',_'C',_'E',_'S',_'!'>
  ::size();
  cts::string::string((string *)poVar3,CONCAT17(uVar5,in_stack_fffffffffffff7d8));
  local_4f8 = cts::string::data((string *)0x10383b);
  local_4f0 = local_4f8;
  sVar4 = cts::anon_unknown_2::decode(0xc63b3130,0,0xc63b3176);
  *local_4f0 = (char)sVar4;
  local_4e8 = local_4f0;
  sVar4 = cts::anon_unknown_2::decode(0xb7ab7ad9,1,0xb7ab7a5d);
  local_4e8[1] = (char)sVar4;
  local_4e0 = local_4e8;
  sVar4 = cts::anon_unknown_2::decode(0xd5fa3948,2,0xd5fa3818);
  local_4e0[2] = (char)sVar4;
  local_4d8 = local_4e0;
  sVar4 = cts::anon_unknown_2::decode(0x46d55ed7,3,0x46d55c97);
  local_4d8[3] = (char)sVar4;
  local_4d0 = local_4d8;
  sVar4 = cts::anon_unknown_2::decode(0xe2e7d4ba,4,0xe2e7d10a);
  local_4d0[4] = (char)sVar4;
  local_4c8 = local_4d0;
  sVar4 = cts::anon_unknown_2::decode(0x897885a1,5,0x89788ce1);
  local_4c8[5] = (char)sVar4;
  local_4c0 = local_4c8;
  sVar4 = cts::anon_unknown_2::decode(0x1a8d44c,6,0x1a8c0cc);
  local_4c0[6] = (char)sVar4;
  local_4b8 = local_4c0;
  sVar4 = cts::anon_unknown_2::decode(0x62be05e8,7,0x62be05bb);
  local_4b8[7] = (char)sVar4;
  local_4b0 = local_4b8;
  sVar4 = cts::anon_unknown_2::decode(0x85a0bf5a,8,0x85a0bfde);
  local_4b0[8] = (char)sVar4;
  local_4a8 = local_4b0;
  sVar4 = cts::anon_unknown_2::decode(0xceb92501,9,0xceb925a5);
  local_4a8[9] = (char)sVar4;
  local_4a0 = local_4a8;
  sVar4 = cts::anon_unknown_2::decode(0x2df29830,10,0x2df29ac0);
  local_4a0[10] = (char)sVar4;
  local_498 = local_4a0;
  sVar4 = cts::anon_unknown_2::decode(0x58294a2f,0xb,0x58294f1f);
  local_498[0xb] = (char)sVar4;
  local_490 = local_498;
  sVar4 = cts::anon_unknown_2::decode(0xe6155b52,0xc,0xe61551f2);
  local_490[0xc] = (char)sVar4;
  local_488 = local_490;
  sVar4 = cts::anon_unknown_2::decode(0x6acc90a9,0xd,0x6acc88a9);
  local_488[0xd] = (char)sVar4;
  local_480 = local_488;
  sVar4 = cts::anon_unknown_2::decode(0x7fc639da,0xe,0x7fc639f4);
  local_480[0xe] = (char)sVar4;
  local_478 = local_480;
  sVar4 = cts::anon_unknown_2::decode(0x5d6b1c07,0xf,0x5d6b1cc3);
  local_478[0xf] = (char)sVar4;
  local_470 = local_478;
  sVar4 = cts::anon_unknown_2::decode(0x77601ad6,0x10,0x77601b46);
  local_470[0x10] = (char)sVar4;
  local_468 = local_470;
  sVar4 = cts::anon_unknown_2::decode(0x41043af5,0x11,0x410439ed);
  local_468[0x11] = (char)sVar4;
  local_460 = local_468;
  sVar4 = cts::anon_unknown_2::decode(0xe0df57d8,0x12,0xe0df5268);
  local_460[0x12] = (char)sVar4;
  local_458 = local_460;
  sVar4 = cts::anon_unknown_2::decode(0xaec39e87,0x13,0xaec392a7);
  local_458[0x13] = (char)sVar4;
  local_450 = local_458;
  sVar4 = cts::anon_unknown_2::decode(0x5b1af91a,0x14,0x5b1aefda);
  local_450[0x14] = (char)sVar4;
  local_448 = local_450;
  sVar4 = cts::anon_unknown_2::decode(0x4a7fd44,0x15,0x4a7fd71);
  local_448[0x15] = (char)sVar4;
  local_440 = local_448;
  sVar4 = cts::anon_unknown_2::decode(0x27fad8ce,0x16,0x27fad81c);
  local_440[0x16] = (char)sVar4;
  local_438 = local_440;
  sVar4 = cts::anon_unknown_2::decode(0x510315b7,0x17,0x510314cb);
  local_438[0x17] = (char)sVar4;
  local_430 = local_438;
  sVar4 = cts::anon_unknown_2::decode(0x9bb2e096,0x18,0x9bb2e3ae);
  local_430[0x18] = (char)sVar4;
  local_428 = local_430;
  sVar4 = cts::anon_unknown_2::decode(0xa739d1d5,0x19,0xa739d735);
  local_428[0x19] = (char)sVar4;
  local_420 = local_428;
  sVar4 = cts::anon_unknown_2::decode(0xca4af3d0,0x1a,0xca4aff10);
  local_420[0x1a] = (char)sVar4;
  local_418 = local_420;
  sVar4 = cts::anon_unknown_2::decode(0x4c6e50ef,0x1b,0x4c6e472f);
  local_418[0x1b] = (char)sVar4;
  local_410 = local_418;
  sVar4 = cts::anon_unknown_2::decode(0x1fc4afe,0x1c,0x1fc4ac2);
  local_410[0x1c] = (char)sVar4;
  local_408 = local_410;
  sVar4 = cts::anon_unknown_2::decode(0x28fa0bef,0x1d,0x28fa0b39);
  local_408[0x1d] = (char)sVar4;
  local_400 = local_408;
  sVar4 = cts::anon_unknown_2::decode(0xa2b3af0,0x1e,0xa2b3b44);
  local_400[0x1e] = (char)sVar4;
  local_3f8 = local_400;
  sVar4 = cts::anon_unknown_2::decode(0xc3e20e4b,0x1f,0xc3e20dd3);
  local_3f8[0x1f] = (char)sVar4;
  local_3f0 = local_3f8;
  sVar4 = cts::anon_unknown_2::decode(0x9a06bd16,0x20,0x9a06b916);
  local_3f0[0x20] = (char)sVar4;
  local_3e8 = local_3f0;
  sVar4 = cts::anon_unknown_2::decode(0xcfab111d,0x21,0xcfab1d7d);
  local_3e8[0x21] = (char)sVar4;
  local_3e0 = local_3e8;
  sVar4 = cts::anon_unknown_2::decode(0xd7145978,0x22,0xd71440b8);
  local_3e0[0x22] = (char)sVar4;
  local_3d8 = local_3e0;
  sVar4 = cts::anon_unknown_2::decode(0x8c378cf4,0x23,0x8c378cb7);
  local_3d8[0x23] = (char)sVar4;
  local_3d0 = local_3d8;
  sVar4 = cts::anon_unknown_2::decode(0x3b310244,0x24,0x3b3102aa);
  local_3d0[0x24] = (char)sVar4;
  local_3c8 = local_3d0;
  sVar4 = cts::anon_unknown_2::decode(0x795d3a9,0x25,0x795d201);
  local_3c8[0x25] = (char)sVar4;
  local_3c0 = local_3c8;
  sVar4 = cts::anon_unknown_2::decode(0xd2d00034,0x26,0xd2d0036c);
  local_3c0[0x26] = (char)sVar4;
  local_3b8 = local_3c0;
  sVar4 = cts::anon_unknown_2::decode(0x27e8208b,0x27,0x27e827db);
  local_3b8[0x27] = (char)sVar4;
  local_3b0 = local_3b8;
  sVar4 = cts::anon_unknown_2::decode(0xa77d327e,0x28,0xa77d3b7e);
  local_3b0[0x28] = (char)sVar4;
  local_3a8 = local_3b0;
  sVar4 = cts::anon_unknown_2::decode(0x72cd3045,0x29,0x72cd2cc5);
  local_3a8[0x29] = (char)sVar4;
  local_3a0 = local_3a8;
  sVar4 = cts::anon_unknown_2::decode(0x2fedb718,0x2a,0x2fedb760);
  local_3a0[0x2a] = (char)sVar4;
  local_398 = local_3a0;
  sVar4 = cts::anon_unknown_2::decode(0x4af183a9,0x2b,0x4af1833f);
  local_398[0x2b] = (char)sVar4;
  local_390 = local_398;
  sVar4 = cts::anon_unknown_2::decode(0x1624b62a,0x2c,0x1624b792);
  local_390[0x2c] = (char)sVar4;
  local_388 = local_390;
  sVar4 = cts::anon_unknown_2::decode(0xeab27279,0x2d,0xeab271c9);
  local_388[0x2d] = (char)sVar4;
  local_380 = local_388;
  sVar4 = cts::anon_unknown_2::decode(0x5d75d754,0x2e,0x5d75d094);
  local_380[0x2e] = (char)sVar4;
  local_378 = local_380;
  sVar4 = cts::anon_unknown_2::decode(0x4af98ce3,0x2f,0x4af982e3);
  local_378[0x2f] = (char)sVar4;
  local_370 = local_378;
  sVar4 = cts::anon_unknown_2::decode(0x3d6c2a66,0x30,0x3d6c0ae6);
  local_370[0x30] = (char)sVar4;
  local_368 = local_370;
  sVar4 = cts::anon_unknown_2::decode(0x77b92587,0x31,0x77b9250d);
  local_368[0x31] = (char)sVar4;
  local_360 = local_368;
  sVar4 = cts::anon_unknown_2::decode(0xb3de03ac,0x32,0xb3de0308);
  local_360[0x32] = (char)sVar4;
  local_358 = local_360;
  sVar4 = cts::anon_unknown_2::decode(0x1fb24b27,0x33,0x1fb24ac7);
  local_358[0x33] = (char)sVar4;
  local_350 = local_358;
  sVar4 = cts::anon_unknown_2::decode(0x2fb70a92,0x34,0x2fb7097a);
  local_350[0x34] = (char)sVar4;
  local_348 = local_350;
  sVar4 = cts::anon_unknown_2::decode(0x836b0201,0x35,0x836b0a91);
  local_348[0x35] = (char)sVar4;
  local_340 = local_348;
  sVar4 = cts::anon_unknown_2::decode(0x973d4d7c,0x36,0x973d42bc);
  local_340[0x36] = (char)sVar4;
  local_338 = local_340;
  sVar4 = cts::anon_unknown_2::decode(0xd77e21eb,0x37,0xd77e3eeb);
  local_338[0x37] = (char)sVar4;
  local_330 = local_338;
  sVar4 = cts::anon_unknown_2::decode(0x9fdcc7c4,0x38,0x9fdcc74e);
  local_330[0x38] = (char)sVar4;
  local_328 = local_330;
  sVar4 = cts::anon_unknown_2::decode(0xc8ac26e7,0x39,0xc8ac2655);
  local_328[0x39] = (char)sVar4;
  local_320 = local_328;
  sVar4 = cts::anon_unknown_2::decode(0xc2bfc1b0,0x3a,0xc2bfc3b0);
  local_320[0x3a] = (char)sVar4;
  local_318 = local_320;
  sVar4 = cts::anon_unknown_2::decode(0xa45407cf,0x3b,0xa454034f);
  local_318[0x3b] = (char)sVar4;
  local_310 = local_318;
  sVar4 = cts::anon_unknown_2::decode(0x60bb90e2,0x3c,0x60bb9862);
  local_310[0x3c] = (char)sVar4;
  local_308 = local_310;
  sVar4 = cts::anon_unknown_2::decode(0xc63ead79,0x3d,0xc63ebc59);
  local_308[0x3d] = (char)sVar4;
  local_300 = local_308;
  sVar4 = cts::anon_unknown_2::decode(0xb15aee64,0x3e,0xb15af9e4);
  local_300[0x3e] = (char)sVar4;
  local_2f8 = local_300;
  sVar4 = cts::anon_unknown_2::decode(0xe4e27b7d,0x3f,0xe4e27bf3);
  local_2f8[0x3f] = (char)sVar4;
  local_2f0 = local_2f8;
  sVar4 = cts::anon_unknown_2::decode(0x340d1192,0x40,0x340d10b6);
  local_2f0[0x40] = (char)sVar4;
  local_2e8 = local_2f0;
  sVar4 = cts::anon_unknown_2::decode(0xb7875119,0x41,0xb787509d);
  local_2e8[0x41] = (char)sVar4;
  local_2e0 = local_2e8;
  sVar4 = cts::anon_unknown_2::decode(0x57c19d00,0x42,0x57c19958);
  local_2e0[0x42] = (char)sVar4;
  local_2d8 = local_2e0;
  sVar4 = cts::anon_unknown_2::decode(0xcdf4c5c7,0x43,0xcdf4ccd7);
  local_2d8[0x43] = (char)sVar4;
  local_2d0 = local_2d8;
  sVar4 = cts::anon_unknown_2::decode(0x3c7a08ca,0x44,0x3c7a044a);
  local_2d0[0x44] = (char)sVar4;
  local_2c8 = local_2d0;
  sVar4 = cts::anon_unknown_2::decode(0x57908261,0x45,0x5790a721);
  local_2c8[0x45] = (char)sVar4;
  local_2c0 = local_2c8;
  sVar4 = cts::anon_unknown_2::decode(0xa3979683,0x46,0xa397960c);
  local_2c0[0x46] = (char)sVar4;
  local_2b8 = local_2c0;
  sVar4 = cts::anon_unknown_2::decode(0x981658e3,0x47,0x981659fb);
  local_2b8[0x47] = (char)sVar4;
  local_2b0 = local_2b8;
  sVar4 = cts::anon_unknown_2::decode(0xa6ee8532,0x48,0xa6ee871e);
  local_2b0[0x48] = (char)sVar4;
  local_2a8 = local_2b0;
  sVar4 = cts::anon_unknown_2::decode(0xf24fc795,0x49,0xf24fc3e5);
  local_2a8[0x49] = (char)sVar4;
  local_2a0 = local_2a8;
  sVar4 = cts::anon_unknown_2::decode(0x73e62dd0,0x4a,0x73e62400);
  local_2a0[0x4a] = (char)sVar4;
  local_298 = local_2a0;
  sVar4 = cts::anon_unknown_2::decode(0x5576cadf,0x4b,0x5576c75f);
  local_298[0x4b] = (char)sVar4;
  cts::(anonymous_namespace)::ximpl<1596845362ul>(local_298);
  local_519 = 1;
  poVar3 = cts::operator<<(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  cts::string::~string((string *)in_stack_fffffffffffff7b0);
  local_500 = &local_571;
  local_508 = local_808;
  local_288 = 0x268;
  local_280 = local_508;
  local_278 = local_500;
  sVar4 = cts::
          XChars<'F',_'A',_'R',_'E',_'W',_'E',_'L',_'L',_':',_'_',_'T',_'H',_'I',_'S',_'_',_'S',_'T',_'R',_'I',_'N',_'G',_'_',_'S',_'H',_'O',_'U',_'L',_'D',_'_',_'N',_'O',_'T',_'_',_'B',_'E',_'_',_'S',_'E',_'E',_'N',_'_',_'I',_'N',_'_',_'B',_'I',_'N',_'A',_'R',_'Y',_'_',_'E',_'I',_'T',_'H',_'E',_'R',_'_',_'F',_'U',_'L',_'L',_'_',_'O',_'R',_'_',_'I',_'N',_'_',_'P',_'I',_'E',_'C',_'E',_'S',_'!'>
          ::size();
  if (sVar4 < 0x269) {
    local_290 = local_280;
    local_268 = local_280;
    local_260 = local_280;
    sVar4 = cts::anon_unknown_2::decode(0xc63b3130,0,0xc63b3176);
    *local_260 = (char)sVar4;
    local_258 = local_260;
    sVar4 = cts::anon_unknown_2::decode(0xb7ab7ad9,1,0xb7ab7a5d);
    local_258[1] = (char)sVar4;
    local_250 = local_258;
    sVar4 = cts::anon_unknown_2::decode(0xd5fa3948,2,0xd5fa3818);
    local_250[2] = (char)sVar4;
    local_248 = local_250;
    sVar4 = cts::anon_unknown_2::decode(0x46d55ed7,3,0x46d55c97);
    local_248[3] = (char)sVar4;
    local_240 = local_248;
    sVar4 = cts::anon_unknown_2::decode(0xe2e7d4ba,4,0xe2e7d10a);
    local_240[4] = (char)sVar4;
    local_238 = local_240;
    sVar4 = cts::anon_unknown_2::decode(0x897885a1,5,0x89788ce1);
    local_238[5] = (char)sVar4;
    local_230 = local_238;
    sVar4 = cts::anon_unknown_2::decode(0x1a8d44c,6,0x1a8c0cc);
    local_230[6] = (char)sVar4;
    local_228 = local_230;
    sVar4 = cts::anon_unknown_2::decode(0x62be05e8,7,0x62be05bb);
    local_228[7] = (char)sVar4;
    local_220 = local_228;
    sVar4 = cts::anon_unknown_2::decode(0x85a0bf5a,8,0x85a0bfde);
    local_220[8] = (char)sVar4;
    local_218 = local_220;
    sVar4 = cts::anon_unknown_2::decode(0xceb92501,9,0xceb925a5);
    local_218[9] = (char)sVar4;
    local_210 = local_218;
    sVar4 = cts::anon_unknown_2::decode(0x2df29830,10,0x2df29ac0);
    local_210[10] = (char)sVar4;
    local_208 = local_210;
    sVar4 = cts::anon_unknown_2::decode(0x58294a2f,0xb,0x58294f1f);
    local_208[0xb] = (char)sVar4;
    local_200 = local_208;
    sVar4 = cts::anon_unknown_2::decode(0xe6155b52,0xc,0xe61551f2);
    local_200[0xc] = (char)sVar4;
    local_1f8 = local_200;
    sVar4 = cts::anon_unknown_2::decode(0x6acc90a9,0xd,0x6acc88a9);
    local_1f8[0xd] = (char)sVar4;
    local_1f0 = local_1f8;
    sVar4 = cts::anon_unknown_2::decode(0x7fc639da,0xe,0x7fc639f4);
    local_1f0[0xe] = (char)sVar4;
    local_1e8 = local_1f0;
    sVar4 = cts::anon_unknown_2::decode(0x5d6b1c07,0xf,0x5d6b1cc3);
    local_1e8[0xf] = (char)sVar4;
    local_1e0 = local_1e8;
    sVar4 = cts::anon_unknown_2::decode(0x77601ad6,0x10,0x77601b46);
    local_1e0[0x10] = (char)sVar4;
    local_1d8 = local_1e0;
    sVar4 = cts::anon_unknown_2::decode(0x41043af5,0x11,0x410439ed);
    local_1d8[0x11] = (char)sVar4;
    local_1d0 = local_1d8;
    sVar4 = cts::anon_unknown_2::decode(0xe0df57d8,0x12,0xe0df5268);
    local_1d0[0x12] = (char)sVar4;
    local_1c8 = local_1d0;
    sVar4 = cts::anon_unknown_2::decode(0xaec39e87,0x13,0xaec392a7);
    local_1c8[0x13] = (char)sVar4;
    local_1c0 = local_1c8;
    sVar4 = cts::anon_unknown_2::decode(0x5b1af91a,0x14,0x5b1aefda);
    local_1c0[0x14] = (char)sVar4;
    local_1b8 = local_1c0;
    sVar4 = cts::anon_unknown_2::decode(0x4a7fd44,0x15,0x4a7fd71);
    local_1b8[0x15] = (char)sVar4;
    local_1b0 = local_1b8;
    sVar4 = cts::anon_unknown_2::decode(0x27fad8ce,0x16,0x27fad81c);
    local_1b0[0x16] = (char)sVar4;
    local_1a8 = local_1b0;
    sVar4 = cts::anon_unknown_2::decode(0x510315b7,0x17,0x510314cb);
    local_1a8[0x17] = (char)sVar4;
    local_1a0 = local_1a8;
    sVar4 = cts::anon_unknown_2::decode(0x9bb2e096,0x18,0x9bb2e3ae);
    local_1a0[0x18] = (char)sVar4;
    local_198 = local_1a0;
    sVar4 = cts::anon_unknown_2::decode(0xa739d1d5,0x19,0xa739d735);
    local_198[0x19] = (char)sVar4;
    local_190 = local_198;
    sVar4 = cts::anon_unknown_2::decode(0xca4af3d0,0x1a,0xca4aff10);
    local_190[0x1a] = (char)sVar4;
    local_188 = local_190;
    sVar4 = cts::anon_unknown_2::decode(0x4c6e50ef,0x1b,0x4c6e472f);
    local_188[0x1b] = (char)sVar4;
    local_180 = local_188;
    sVar4 = cts::anon_unknown_2::decode(0x1fc4afe,0x1c,0x1fc4ac2);
    local_180[0x1c] = (char)sVar4;
    local_178 = local_180;
    sVar4 = cts::anon_unknown_2::decode(0x28fa0bef,0x1d,0x28fa0b39);
    local_178[0x1d] = (char)sVar4;
    local_170 = local_178;
    sVar4 = cts::anon_unknown_2::decode(0xa2b3af0,0x1e,0xa2b3b44);
    local_170[0x1e] = (char)sVar4;
    local_168 = local_170;
    sVar4 = cts::anon_unknown_2::decode(0xc3e20e4b,0x1f,0xc3e20dd3);
    local_168[0x1f] = (char)sVar4;
    local_160 = local_168;
    sVar4 = cts::anon_unknown_2::decode(0x9a06bd16,0x20,0x9a06b916);
    local_160[0x20] = (char)sVar4;
    local_158 = local_160;
    sVar4 = cts::anon_unknown_2::decode(0xcfab111d,0x21,0xcfab1d7d);
    local_158[0x21] = (char)sVar4;
    local_150 = local_158;
    sVar4 = cts::anon_unknown_2::decode(0xd7145978,0x22,0xd71440b8);
    local_150[0x22] = (char)sVar4;
    local_148 = local_150;
    sVar4 = cts::anon_unknown_2::decode(0x8c378cf4,0x23,0x8c378cb7);
    local_148[0x23] = (char)sVar4;
    local_140 = local_148;
    sVar4 = cts::anon_unknown_2::decode(0x3b310244,0x24,0x3b3102aa);
    local_140[0x24] = (char)sVar4;
    local_138 = local_140;
    sVar4 = cts::anon_unknown_2::decode(0x795d3a9,0x25,0x795d201);
    local_138[0x25] = (char)sVar4;
    local_130 = local_138;
    sVar4 = cts::anon_unknown_2::decode(0xd2d00034,0x26,0xd2d0036c);
    local_130[0x26] = (char)sVar4;
    local_128 = local_130;
    sVar4 = cts::anon_unknown_2::decode(0x27e8208b,0x27,0x27e827db);
    local_128[0x27] = (char)sVar4;
    local_120 = local_128;
    sVar4 = cts::anon_unknown_2::decode(0xa77d327e,0x28,0xa77d3b7e);
    local_120[0x28] = (char)sVar4;
    local_118 = local_120;
    sVar4 = cts::anon_unknown_2::decode(0x72cd3045,0x29,0x72cd2cc5);
    local_118[0x29] = (char)sVar4;
    local_110 = local_118;
    sVar4 = cts::anon_unknown_2::decode(0x2fedb718,0x2a,0x2fedb760);
    local_110[0x2a] = (char)sVar4;
    local_108 = local_110;
    sVar4 = cts::anon_unknown_2::decode(0x4af183a9,0x2b,0x4af1833f);
    local_108[0x2b] = (char)sVar4;
    local_100 = local_108;
    sVar4 = cts::anon_unknown_2::decode(0x1624b62a,0x2c,0x1624b792);
    local_100[0x2c] = (char)sVar4;
    local_f8 = local_100;
    sVar4 = cts::anon_unknown_2::decode(0xeab27279,0x2d,0xeab271c9);
    local_f8[0x2d] = (char)sVar4;
    local_f0 = local_f8;
    sVar4 = cts::anon_unknown_2::decode(0x5d75d754,0x2e,0x5d75d094);
    local_f0[0x2e] = (char)sVar4;
    local_e8 = local_f0;
    sVar4 = cts::anon_unknown_2::decode(0x4af98ce3,0x2f,0x4af982e3);
    local_e8[0x2f] = (char)sVar4;
    local_e0 = local_e8;
    sVar4 = cts::anon_unknown_2::decode(0x3d6c2a66,0x30,0x3d6c0ae6);
    local_e0[0x30] = (char)sVar4;
    local_d8 = local_e0;
    sVar4 = cts::anon_unknown_2::decode(0x77b92587,0x31,0x77b9250d);
    local_d8[0x31] = (char)sVar4;
    local_d0 = local_d8;
    sVar4 = cts::anon_unknown_2::decode(0xb3de03ac,0x32,0xb3de0308);
    local_d0[0x32] = (char)sVar4;
    local_c8 = local_d0;
    sVar4 = cts::anon_unknown_2::decode(0x1fb24b27,0x33,0x1fb24ac7);
    local_c8[0x33] = (char)sVar4;
    local_c0 = local_c8;
    sVar4 = cts::anon_unknown_2::decode(0x2fb70a92,0x34,0x2fb7097a);
    local_c0[0x34] = (char)sVar4;
    local_b8 = local_c0;
    sVar4 = cts::anon_unknown_2::decode(0x836b0201,0x35,0x836b0a91);
    local_b8[0x35] = (char)sVar4;
    local_b0 = local_b8;
    sVar4 = cts::anon_unknown_2::decode(0x973d4d7c,0x36,0x973d42bc);
    local_b0[0x36] = (char)sVar4;
    local_a8 = local_b0;
    sVar4 = cts::anon_unknown_2::decode(0xd77e21eb,0x37,0xd77e3eeb);
    local_a8[0x37] = (char)sVar4;
    local_a0 = local_a8;
    sVar4 = cts::anon_unknown_2::decode(0x9fdcc7c4,0x38,0x9fdcc74e);
    local_a0[0x38] = (char)sVar4;
    local_98 = local_a0;
    sVar4 = cts::anon_unknown_2::decode(0xc8ac26e7,0x39,0xc8ac2655);
    local_98[0x39] = (char)sVar4;
    local_90 = local_98;
    sVar4 = cts::anon_unknown_2::decode(0xc2bfc1b0,0x3a,0xc2bfc3b0);
    local_90[0x3a] = (char)sVar4;
    local_88 = local_90;
    sVar4 = cts::anon_unknown_2::decode(0xa45407cf,0x3b,0xa454034f);
    local_88[0x3b] = (char)sVar4;
    local_80 = local_88;
    sVar4 = cts::anon_unknown_2::decode(0x60bb90e2,0x3c,0x60bb9862);
    local_80[0x3c] = (char)sVar4;
    local_78 = local_80;
    sVar4 = cts::anon_unknown_2::decode(0xc63ead79,0x3d,0xc63ebc59);
    local_78[0x3d] = (char)sVar4;
    local_70 = local_78;
    sVar4 = cts::anon_unknown_2::decode(0xb15aee64,0x3e,0xb15af9e4);
    local_70[0x3e] = (char)sVar4;
    local_68 = local_70;
    sVar4 = cts::anon_unknown_2::decode(0xe4e27b7d,0x3f,0xe4e27bf3);
    local_68[0x3f] = (char)sVar4;
    local_60 = local_68;
    sVar4 = cts::anon_unknown_2::decode(0x340d1192,0x40,0x340d10b6);
    local_60[0x40] = (char)sVar4;
    local_58 = local_60;
    sVar4 = cts::anon_unknown_2::decode(0xb7875119,0x41,0xb787509d);
    local_58[0x41] = (char)sVar4;
    local_50 = local_58;
    sVar4 = cts::anon_unknown_2::decode(0x57c19d00,0x42,0x57c19958);
    local_50[0x42] = (char)sVar4;
    local_48 = local_50;
    sVar4 = cts::anon_unknown_2::decode(0xcdf4c5c7,0x43,0xcdf4ccd7);
    local_48[0x43] = (char)sVar4;
    local_40 = local_48;
    sVar4 = cts::anon_unknown_2::decode(0x3c7a08ca,0x44,0x3c7a044a);
    local_40[0x44] = (char)sVar4;
    local_38 = local_40;
    sVar4 = cts::anon_unknown_2::decode(0x57908261,0x45,0x5790a721);
    local_38[0x45] = (char)sVar4;
    local_30 = local_38;
    sVar4 = cts::anon_unknown_2::decode(0xa3979683,0x46,0xa397960c);
    local_30[0x46] = (char)sVar4;
    local_28 = local_30;
    sVar4 = cts::anon_unknown_2::decode(0x981658e3,0x47,0x981659fb);
    local_28[0x47] = (char)sVar4;
    local_20 = local_28;
    sVar4 = cts::anon_unknown_2::decode(0xa6ee8532,0x48,0xa6ee871e);
    local_20[0x48] = (char)sVar4;
    local_18 = local_20;
    sVar4 = cts::anon_unknown_2::decode(0xf24fc795,0x49,0xf24fc3e5);
    local_18[0x49] = (char)sVar4;
    local_10 = local_18;
    sVar4 = cts::anon_unknown_2::decode(0x73e62dd0,0x4a,0x73e62400);
    local_10[0x4a] = (char)sVar4;
    local_8 = local_10;
    sVar4 = cts::anon_unknown_2::decode(0x5576cadf,0x4b,0x5576c75f);
    local_8[0x4b] = (char)sVar4;
    cts::(anonymous_namespace)::ximpl<1596845362ul>(local_8);
    uVar1 = local_288;
    sVar4 = cts::
            XChars<'F',_'A',_'R',_'E',_'W',_'E',_'L',_'L',_':',_'_',_'T',_'H',_'I',_'S',_'_',_'S',_'T',_'R',_'I',_'N',_'G',_'_',_'S',_'H',_'O',_'U',_'L',_'D',_'_',_'N',_'O',_'T',_'_',_'B',_'E',_'_',_'S',_'E',_'E',_'N',_'_',_'I',_'N',_'_',_'B',_'I',_'N',_'A',_'R',_'Y',_'_',_'E',_'I',_'T',_'H',_'E',_'R',_'_',_'F',_'U',_'L',_'L',_'_',_'O',_'R',_'_',_'I',_'N',_'_',_'P',_'I',_'E',_'C',_'E',_'S',_'!'>
            ::size();
    if (sVar4 < uVar1) {
      pcVar2 = local_290;
      sVar4 = cts::
              XChars<'F',_'A',_'R',_'E',_'W',_'E',_'L',_'L',_':',_'_',_'T',_'H',_'I',_'S',_'_',_'S',_'T',_'R',_'I',_'N',_'G',_'_',_'S',_'H',_'O',_'U',_'L',_'D',_'_',_'N',_'O',_'T',_'_',_'B',_'E',_'_',_'S',_'E',_'E',_'N',_'_',_'I',_'N',_'_',_'B',_'I',_'N',_'A',_'R',_'Y',_'_',_'E',_'I',_'T',_'H',_'E',_'R',_'_',_'F',_'U',_'L',_'L',_'_',_'O',_'R',_'_',_'I',_'N',_'_',_'P',_'I',_'E',_'C',_'E',_'S',_'!'>
              ::size();
      pcVar2[sVar4] = '\0';
    }
    local_270 = local_290;
  }
  else {
    local_270 = (char *)0x0;
  }
  printf("in-buf(xored): %s\n",local_270);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	using namespace cts::literals;

	auto sample1 = "Hello"_chars;
	auto sample2 = "Hello"_ichars;

	//std::printf("%s = %u:%u:%u\n", __TIME__, CTS_TIME(0), CTS_TIME(3), CTS_TIME(6));
	std::printf("plain 1: %s\n", sample1.c_str());
	std::printf("plain 2: %s\n", sample2.c_str());

	{
		char constexpr csz[] = "Hello World";
		static_assert(sample1.match(csz, csz+sizeof(csz)), "");
		static_assert(sample2.match(csz, csz+sizeof(csz)), "");
	}
	{
		char constexpr csz[] = "hello world";
		static_assert(!sample1.match(csz, csz+sizeof(csz)), "");
		static_assert(sample2.match(csz, csz+sizeof(csz)), "");
	}

	auto sample3 = "HELLO"_chars;
	{
		char constexpr csz[] = "helLO worLD";
		static_assert(!sample3.match(csz, csz+sizeof(csz)), "");
		static_assert(sample3.match(csz, csz+sizeof(csz), 3), "");
		static_assert(!sample3.match(csz, csz+sizeof(csz), 5), "");
	}

	auto const xsHidden = "FAREWELL: THIS STRING SHOULD NOT BE SEEN IN BINARY EITHER FULL OR IN PIECES!"_xchars;
	std::cout << "xored: " << xsHidden.str() << std::endl;

	std::size_t buf[xsHidden.size()+1];
	std::printf("in-buf(xored): %s\n", xsHidden.str(buf));

	return 0;
}